

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase66::run(TestCase66 *this)

{
  Reader reader_00;
  Reader reader_01;
  Reader reader_02;
  undefined1 auVar1 [40];
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  ReaderOptions options;
  AlignedData<1> nullRoot;
  ArrayPtr<const_capnp::word> segments [1];
  SegmentArrayMessageReader reader;
  WirePointer local_1b0;
  Reader local_1a8;
  StructReader local_188;
  StructReader local_158;
  ArrayPtr<const_capnp::word> local_128;
  PointerReader local_118;
  SegmentArrayMessageReader local_f8;
  
  local_1b0.offsetAndKind.value = 0;
  local_1b0.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  local_128.size_ = 1;
  segments_00.size_ = 1;
  segments_00.ptr = &local_128;
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  local_128.ptr = (word *)&local_1b0;
  SegmentArrayMessageReader::SegmentArrayMessageReader(&local_f8,segments_00,options);
  MessageReader::getRootInternal(&local_1a8,&local_f8.super_MessageReader);
  local_118.pointer = local_1a8.reader.pointer;
  local_118.nestingLimit = local_1a8.reader.nestingLimit;
  local_118._28_4_ = local_1a8.reader._28_4_;
  local_118.segment = local_1a8.reader.segment;
  local_118.capTable = local_1a8.reader.capTable;
  PointerReader::getStruct(&local_158,&local_118,(word *)0x0);
  reader_00._reader.capTable = local_158.capTable;
  reader_00._reader.segment = local_158.segment;
  reader_00._reader.data = local_158.data;
  reader_00._reader.pointers = local_158.pointers;
  reader_00._reader.dataSize = local_158.dataSize;
  reader_00._reader.pointerCount = local_158.pointerCount;
  reader_00._reader._38_2_ = local_158._38_2_;
  reader_00._reader.nestingLimit = local_158.nestingLimit;
  reader_00._reader._44_4_ = local_158._44_4_;
  checkTestMessage(reader_00);
  local_118.segment = (SegmentReader *)0x0;
  local_118.capTable = (CapTableReader *)0x0;
  local_118.nestingLimit = 0x7fffffff;
  local_118.pointer = &local_1b0;
  PointerReader::getStruct(&local_188,&local_118,(word *)0x0);
  reader_01._reader.capTable = local_188.capTable;
  reader_01._reader.segment = local_188.segment;
  reader_01._reader.data = local_188.data;
  reader_01._reader.pointers = local_188.pointers;
  reader_01._reader.dataSize = local_188.dataSize;
  reader_01._reader.pointerCount = local_188.pointerCount;
  reader_01._reader._38_2_ = local_188._38_2_;
  reader_01._reader.nestingLimit = local_188.nestingLimit;
  reader_01._reader._44_4_ = local_188._44_4_;
  checkTestMessage(reader_01);
  auVar1 = ZEXT1640(ZEXT816(0));
  reader_02._reader._40_8_ = 0x7fffffff;
  reader_02._reader.segment = (SegmentReader *)auVar1._0_8_;
  reader_02._reader.capTable = (CapTableReader *)auVar1._8_8_;
  reader_02._reader.data = (void *)auVar1._16_8_;
  reader_02._reader.pointers = (WirePointer *)auVar1._24_8_;
  reader_02._reader.dataSize = auVar1._32_4_;
  reader_02._reader.pointerCount = auVar1._36_2_;
  reader_02._reader._38_2_ = auVar1._38_2_;
  checkTestMessage(reader_02);
  SegmentArrayMessageReader::~SegmentArrayMessageReader(&local_f8);
  return;
}

Assistant:

TEST(Encoding, Defaults) {
  AlignedData<1> nullRoot = {{0, 0, 0, 0, 0, 0, 0, 0}};
  kj::ArrayPtr<const word> segments[1] = {kj::arrayPtr(nullRoot.words, 1)};
  SegmentArrayMessageReader reader(kj::arrayPtr(segments, 1));

  checkTestMessage(reader.getRoot<TestDefaults>());
  checkTestMessage(readMessageUnchecked<TestDefaults>(nullRoot.words));

  checkTestMessage(TestDefaults::Reader());
}